

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rANS_static.c
# Opt level: O3

uchar * rans_compress_O1(uchar *in,uint in_size,uint *out_size)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  ushort uVar7;
  ushort uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  bool bVar14;
  char cVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  uchar *puVar19;
  ulong uVar20;
  uchar *puVar21;
  byte *pbVar22;
  ulong uVar23;
  long lVar24;
  uchar *puVar25;
  uint uVar26;
  ulong uVar27;
  undefined1 *puVar28;
  undefined1 *puVar29;
  short sVar30;
  int iVar31;
  uint uVar32;
  long lVar33;
  uint *puVar34;
  uint uVar35;
  uint uVar36;
  byte *pbVar37;
  size_t __n;
  uint uVar38;
  int *piVar39;
  long lVar40;
  uint *puVar41;
  int iVar42;
  int iVar43;
  ulong uVar44;
  uint uVar45;
  undefined1 *__s;
  uint uVar46;
  int iVar47;
  double dVar48;
  double dVar49;
  int T [256];
  int F [256] [256];
  RansEncSymbol syms [256] [256];
  byte bVar50;
  byte bVar51;
  
  if (in_size < 4) {
    puVar19 = rans_compress_O0(in,in_size,out_size);
    return puVar19;
  }
  dVar49 = (double)in_size * 1.05;
  dVar48 = dVar49 + 198147.0 + 9.0;
  uVar20 = (ulong)dVar48;
  puVar19 = (uchar *)malloc((long)(dVar48 - 9.223372036854776e+18) & (long)uVar20 >> 0x3f | uVar20);
  if (puVar19 == (uchar *)0x0) {
    return (uchar *)0x0;
  }
  puVar21 = puVar19 + (long)(int)dVar49 + 0x3060c;
  __s = &stack0xffffffffffebffc8;
  uVar27 = 0;
  memset(__s,0,0x40000);
  memset(&stack0xffffffffffebfbc8,0,0x400);
  uVar20 = 0;
  do {
    bVar2 = in[uVar27];
    *(int *)(&stack0xffffffffffebfbc8 + uVar20 * 4) =
         *(int *)(&stack0xffffffffffebfbc8 + uVar20 * 4) + 1;
    *(int *)(&stack0xffffffffffebffc8 + (ulong)bVar2 * 4 + uVar20 * 0x400) =
         *(int *)(&stack0xffffffffffebffc8 + (ulong)bVar2 * 4 + uVar20 * 0x400) + 1;
    uVar27 = uVar27 + 1;
    uVar20 = (ulong)bVar2;
  } while (in_size != uVar27);
  uVar20 = (ulong)(in_size >> 2);
  *(int *)(&stack0xffffffffffebffc8 + (ulong)in[uVar20] * 4) =
       *(int *)(&stack0xffffffffffebffc8 + (ulong)in[uVar20] * 4) + 1;
  *(int *)(&stack0xffffffffffebffc8 + (ulong)in[uVar20 * 2] * 4) =
       *(int *)(&stack0xffffffffffebffc8 + (ulong)in[uVar20 * 2] * 4) + 1;
  *(int *)(&stack0xffffffffffebffc8 + (ulong)in[uVar20 * 3] * 4) =
       *(int *)(&stack0xffffffffffebffc8 + (ulong)in[uVar20 * 3] * 4) + 1;
  pbVar22 = puVar19 + 9;
  lVar40 = 0;
  uVar27 = 1;
  puVar29 = &stack0xffffffffffebffcc;
  iVar42 = 0;
  do {
    iVar47 = *(int *)(&stack0xffffffffffebfbc8 + lVar40 * 4);
    if (iVar47 != 0) {
      uVar23 = 0;
      iVar18 = 0;
      iVar43 = 0;
      uVar44 = 0;
      do {
        iVar31 = *(int *)(__s + uVar23 * 4);
        if (iVar31 != 0) {
          if (iVar43 < iVar31) {
            uVar44 = uVar23 & 0xffffffff;
          }
          if (iVar43 <= iVar31) {
            iVar43 = iVar31;
          }
          iVar31 = (int)((double)iVar31 * (4096.0 / (double)iVar47));
          iVar31 = iVar31 + (uint)(iVar31 == 0);
          *(int *)(__s + uVar23 * 4) = iVar31;
          iVar18 = iVar18 + iVar31;
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 != 0x100);
      lVar24 = lVar40 * 0x400;
      *(int *)(&stack0xffffffffffebffc8 + (long)(int)uVar44 * 4 + lVar24) =
           (*(int *)(&stack0xffffffffffebffc8 + (long)(int)uVar44 * 4 + lVar24) - iVar18) + 0xfff;
      if (iVar42 == 0) {
        *pbVar22 = (byte)lVar40;
        iVar42 = 0;
        pbVar37 = pbVar22 + 1;
        if ((lVar40 != 0) && (*(int *)(&stack0xffffffffffebfbc4 + lVar40 * 4) != 0)) {
          uVar46 = (int)lVar40 + 1;
          uVar44 = (ulong)uVar46;
          uVar23 = uVar27;
          if (lVar40 != 0xff) {
            do {
              uVar44 = uVar23;
              if (*(int *)(&stack0xffffffffffebfbc8 + uVar44 * 4) == 0) goto LAB_0012d916;
              uVar23 = uVar44 + 1;
            } while (uVar44 + 1 != 0x100);
            uVar44 = 0x100;
          }
LAB_0012d916:
          iVar42 = (int)uVar44 - uVar46;
          pbVar22[1] = (byte)iVar42;
          pbVar37 = pbVar22 + 2;
        }
      }
      else {
        iVar42 = iVar42 + -1;
        pbVar37 = pbVar22;
      }
      uVar23 = 0;
      iVar43 = -1;
      iVar47 = 0;
      uVar46 = 0;
      puVar28 = puVar29;
      do {
        if (*(int *)(&stack0xffffffffffebffc8 + uVar23 * 4 + lVar24) != 0) {
          if (iVar47 == 0) {
            *pbVar37 = (byte)uVar23;
            iVar47 = 0;
            pbVar22 = pbVar37 + 1;
            if ((uVar23 != 0) && (*(int *)(&stack0xffffffffffebffc4 + uVar23 * 4 + lVar24) != 0)) {
              iVar18 = (int)uVar23 + 1;
              iVar47 = iVar18;
              if (uVar23 < 0xff) {
                lVar33 = 0;
                do {
                  if (*(int *)(puVar28 + lVar33 * 4) == 0) {
                    iVar47 = (int)lVar33 - iVar43;
                    goto LAB_0012d875;
                  }
                  lVar1 = uVar23 + lVar33;
                  lVar33 = lVar33 + 1;
                } while (lVar1 != 0xfe);
                iVar47 = 0x100;
              }
LAB_0012d875:
              iVar47 = iVar47 - iVar18;
              pbVar37[1] = (byte)iVar47;
              pbVar22 = pbVar37 + 2;
            }
          }
          else {
            iVar47 = iVar47 + -1;
            pbVar22 = pbVar37;
          }
          iVar18 = *(int *)(&stack0xffffffffffebffc8 + uVar23 * 4 + lVar24);
          lVar33 = 1;
          pbVar37 = pbVar22;
          if (0x7f < iVar18) {
            *pbVar22 = (byte)((uint)iVar18 >> 8) | 0x80;
            iVar18 = *(int *)(&stack0xffffffffffebffc8 + uVar23 * 4 + lVar24);
            lVar33 = 2;
            pbVar37 = pbVar22 + 1;
          }
          *pbVar37 = (byte)iVar18;
          if (0x1000 < uVar46) {
            __assert_fail("start <= (1u << scale_bits)",
                          "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_byte.h"
                          ,0xba,
                          "void RansEncSymbolInit(RansEncSymbol *, uint32_t, uint32_t, uint32_t)");
          }
          uVar32 = *(uint *)(&stack0xffffffffffebffc8 + uVar23 * 4 + lVar24);
          if (0x1000 - uVar46 < uVar32) {
            __assert_fail("freq <= (1u << scale_bits) - start",
                          "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_byte.h"
                          ,0xbb,
                          "void RansEncSymbolInit(RansEncSymbol *, uint32_t, uint32_t, uint32_t)");
          }
          piVar39 = (int *)(&stack0xffffffffffefffc8 + uVar23 * 0x10 + lVar40 * 0x1000);
          *piVar39 = uVar32 << 0x13;
          *(short *)(piVar39 + 3) = 0x1000 - (short)uVar32;
          if (uVar32 < 2) {
            piVar39[1] = -1;
            piVar39[2] = uVar46 + 0xfff;
            sVar30 = 0x20;
          }
          else {
            sVar30 = 0x1e;
            do {
              cVar15 = (char)sVar30;
              sVar30 = sVar30 + 1;
            } while ((uint)(1 << (cVar15 - 0x1eU & 0x1f)) < uVar32);
            piVar39[1] = (int)((((1L << ((byte)sVar30 & 0x3f)) + (ulong)uVar32) - 1) / (ulong)uVar32
                              );
            piVar39[2] = uVar46;
          }
          pbVar37 = pbVar22 + lVar33;
          *(short *)((long)piVar39 + 0xe) = sVar30;
          uVar46 = uVar32 + uVar46;
        }
        uVar23 = uVar23 + 1;
        iVar43 = iVar43 + -1;
        puVar28 = puVar28 + 4;
      } while (uVar23 != 0x100);
      *pbVar37 = 0;
      pbVar22 = pbVar37 + 1;
    }
    lVar40 = lVar40 + 1;
    uVar27 = uVar27 + 1;
    __s = __s + 0x400;
    puVar29 = puVar29 + 0x400;
  } while (lVar40 != 0x100);
  *pbVar22 = 0;
  pbVar22 = pbVar22 + (1 - (long)puVar19);
  if (0x30602 < (uint)pbVar22) {
    __assert_fail("tab_size < 257*257*3",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_static.c"
                  ,0x1dd,
                  "unsigned char *rans_compress_O1(unsigned char *, unsigned int, unsigned int *)");
  }
  iVar47 = (in_size & 0xfffffffc) - 2;
  bVar2 = in[uVar20 - 1];
  bVar3 = in[uVar20 * 2 + -1];
  iVar42 = (int)(uVar20 * 3);
  uVar38 = (uint)in[(long)iVar42 + -1];
  uVar32 = (uint)in[in_size - 1];
  uVar46 = in_size - 2;
  uVar35 = 0x800000;
  puVar25 = puVar21;
  if (iVar47 < (int)uVar46) {
    uVar35 = 0x800000;
    uVar26 = uVar32;
    do {
      bVar50 = in[uVar46];
      uVar32 = (uint)bVar50;
      uVar36 = *(uint *)(&stack0xffffffffffefffc8 + (ulong)(uVar26 << 4) + (ulong)bVar50 * 0x1000);
      if (uVar36 == 0) goto LAB_0012deb8;
      for (; uVar36 <= uVar35; uVar35 = uVar35 >> 8) {
        puVar25[-1] = (uchar)uVar35;
        puVar25 = puVar25 + -1;
      }
      lVar40 = (ulong)(uVar26 << 4) + (ulong)bVar50 * 0x1000;
      uVar35 = (uint)*(ushort *)(&stack0xffffffffffefffd4 + lVar40) *
               (int)((ulong)*(uint *)(&stack0xffffffffffefffcc + lVar40) * (ulong)uVar35 >>
                    ((&stack0xffffffffffefffd6)[lVar40] & 0x3f)) +
               uVar35 + *(int *)(&stack0xffffffffffefffd0 + lVar40);
      uVar46 = uVar46 - 1;
      uVar26 = (uint)bVar50;
    } while (iVar47 < (int)uVar46);
  }
  if (in_size < 8) {
    uVar46 = 0x800000;
    uVar26 = 0x800000;
    uVar36 = 0x800000;
  }
  else {
    lVar33 = (long)(int)uVar46;
    lVar24 = (long)(iVar42 + -2);
    lVar40 = (ulong)(in_size >> 2) * 2 + -2;
    uVar36 = 0x800000;
    uVar26 = 0x800000;
    uVar46 = 0x800000;
    uVar45 = uVar38;
    uVar13 = (in_size >> 2) - 2;
    bVar50 = bVar2;
    bVar51 = bVar3;
    do {
      bVar4 = in[lVar33];
      uVar38 = *(uint *)(&stack0xffffffffffefffc8 + (ulong)(uVar32 << 4) + (ulong)bVar4 * 0x1000);
      if (uVar38 == 0) goto LAB_0012deb8;
      bVar5 = in[lVar24];
      bVar3 = in[lVar40];
      bVar2 = in[uVar13];
      for (; uVar38 <= uVar35; uVar35 = uVar35 >> 8) {
        puVar25[-1] = (uchar)uVar35;
        puVar25 = puVar25 + -1;
      }
      lVar1 = (ulong)(uVar32 << 4) + (ulong)bVar4 * 0x1000;
      uVar38 = (uint)bVar5;
      uVar32 = *(uint *)(&stack0xffffffffffefffcc + lVar1);
      bVar6 = (&stack0xffffffffffefffd6)[lVar1];
      puVar41 = (uint *)(&stack0xffffffffffefffc8 + (ulong)(uVar45 << 4) + (ulong)bVar5 * 0x1000);
      uVar45 = *puVar41;
      if (uVar45 == 0) goto LAB_0012deb8;
      iVar42 = *(int *)(&stack0xffffffffffefffd0 + lVar1);
      uVar7 = *(ushort *)(&stack0xffffffffffefffd4 + lVar1);
      for (; uVar45 <= uVar36; uVar36 = uVar36 >> 8) {
        puVar25[-1] = (uchar)uVar36;
        puVar25 = puVar25 + -1;
      }
      uVar45 = puVar41[1];
      bVar5 = *(byte *)((long)puVar41 + 0xe);
      puVar34 = (uint *)(&stack0xffffffffffefffc8 + (ulong)bVar51 * 0x10 + (ulong)bVar3 * 0x1000);
      uVar9 = *puVar34;
      if (uVar9 == 0) goto LAB_0012deb8;
      uVar10 = puVar41[2];
      uVar16 = puVar41[3];
      for (; uVar9 <= uVar26; uVar26 = uVar26 >> 8) {
        puVar25[-1] = (uchar)uVar26;
        puVar25 = puVar25 + -1;
      }
      uVar9 = puVar34[1];
      bVar51 = *(byte *)((long)puVar34 + 0xe);
      puVar41 = (uint *)(&stack0xffffffffffefffc8 + (ulong)bVar50 * 0x10 + (ulong)bVar2 * 0x1000);
      uVar11 = *puVar41;
      if (uVar11 == 0) goto LAB_0012deb8;
      uVar12 = puVar34[2];
      uVar17 = puVar34[3];
      for (; uVar11 <= uVar46; uVar46 = uVar46 >> 8) {
        puVar25[-1] = (uchar)uVar46;
        puVar25 = puVar25 + -1;
      }
      uVar35 = uVar35 + iVar42 +
               (int)((ulong)uVar32 * (ulong)uVar35 >> (bVar6 & 0x3f)) * (uint)uVar7;
      uVar36 = uVar36 + uVar10 +
               (int)((ulong)uVar45 * (ulong)uVar36 >> (bVar5 & 0x3f)) * (uint)(ushort)uVar16;
      uVar26 = uVar26 + uVar12 +
               (int)((ulong)uVar9 * (ulong)uVar26 >> (bVar51 & 0x3f)) * (uint)(ushort)uVar17;
      uVar46 = (uint)(ushort)puVar41[3] *
               (int)((ulong)puVar41[1] * (ulong)uVar46 >> (*(byte *)((long)puVar41 + 0xe) & 0x3f)) +
               uVar46 + puVar41[2];
      lVar40 = lVar40 + -1;
      lVar24 = lVar24 + -1;
      lVar33 = lVar33 + -1;
      uVar32 = (uint)bVar4;
      bVar14 = 0 < (int)uVar13;
      uVar45 = uVar38;
      uVar13 = uVar13 - 1;
      bVar50 = bVar2;
      bVar51 = bVar3;
    } while (bVar14);
  }
  uVar32 = uVar32 << 4;
  uVar13 = *(uint *)(&stack0xffffffffffefffc8 + uVar32);
  if (uVar13 != 0) {
    for (; uVar13 <= uVar35; uVar35 = uVar35 >> 8) {
      puVar25[-1] = (uchar)uVar35;
      puVar25 = puVar25 + -1;
    }
    uVar13 = *(uint *)(&stack0xffffffffffefffcc + uVar32);
    bVar50 = (&stack0xffffffffffefffd6)[uVar32];
    uVar38 = uVar38 << 4;
    uVar45 = *(uint *)(&stack0xffffffffffefffc8 + uVar38);
    if (uVar45 != 0) {
      iVar42 = *(int *)(&stack0xffffffffffefffd0 + uVar32);
      uVar7 = *(ushort *)(&stack0xffffffffffefffd4 + uVar32);
      for (; uVar45 <= uVar36; uVar36 = uVar36 >> 8) {
        puVar25[-1] = (uchar)uVar36;
        puVar25 = puVar25 + -1;
      }
      uVar32 = *(uint *)(&stack0xffffffffffefffcc + uVar38);
      bVar51 = (&stack0xffffffffffefffd6)[uVar38];
      lVar40 = (ulong)bVar3 * 0x10;
      uVar45 = *(uint *)(&stack0xffffffffffefffc8 + lVar40);
      if (uVar45 != 0) {
        iVar47 = *(int *)(&stack0xffffffffffefffd0 + uVar38);
        uVar8 = *(ushort *)(&stack0xffffffffffefffd4 + uVar38);
        for (; uVar45 <= uVar26; uVar26 = uVar26 >> 8) {
          puVar25[-1] = (uchar)uVar26;
          puVar25 = puVar25 + -1;
        }
        lVar24 = (ulong)bVar2 * 0x10;
        uVar38 = *(uint *)(&stack0xffffffffffefffc8 + lVar24);
        if (uVar38 != 0) {
          iVar43 = (uint)*(ushort *)(&stack0xffffffffffefffd4 + lVar40) *
                   (int)((ulong)*(uint *)(&stack0xffffffffffefffcc + lVar40) * (ulong)uVar26 >>
                        ((&stack0xffffffffffefffd6)[lVar40] & 0x3f)) +
                   uVar26 + *(int *)(&stack0xffffffffffefffd0 + lVar40);
          iVar47 = uVar36 + iVar47 +
                   (int)((ulong)uVar32 * (ulong)uVar36 >> (bVar51 & 0x3f)) * (uint)uVar8;
          for (; uVar38 <= uVar46; uVar46 = uVar46 >> 8) {
            puVar25[-1] = (uchar)uVar46;
            puVar25 = puVar25 + -1;
          }
          iVar18 = (uint)*(ushort *)(&stack0xffffffffffefffd4 + lVar24) *
                   (int)((ulong)*(uint *)(&stack0xffffffffffefffcc + lVar24) * (ulong)uVar46 >>
                        ((&stack0xffffffffffefffd6)[lVar24] & 0x3f)) +
                   uVar46 + *(int *)(&stack0xffffffffffefffd0 + lVar24);
          *(uint *)(puVar25 + -4) =
               uVar35 + iVar42 +
               (int)((ulong)uVar13 * (ulong)uVar35 >> (bVar50 & 0x3f)) * (uint)uVar7;
          puVar25[-8] = (uchar)iVar47;
          puVar25[-7] = (uchar)((uint)iVar47 >> 8);
          puVar25[-6] = (uchar)((uint)iVar47 >> 0x10);
          puVar25[-5] = (uchar)((uint)iVar47 >> 0x18);
          puVar25[-0xc] = (uchar)iVar43;
          puVar25[-0xb] = (uchar)((uint)iVar43 >> 8);
          puVar25[-10] = (uchar)((uint)iVar43 >> 0x10);
          puVar25[-9] = (uchar)((uint)iVar43 >> 0x18);
          puVar25[-0x10] = (uchar)iVar18;
          puVar25[-0xf] = (uchar)((uint)iVar18 >> 8);
          puVar25[-0xe] = (uchar)((uint)iVar18 >> 0x10);
          puVar25[-0xd] = (uchar)((uint)iVar18 >> 0x18);
          __n = (long)puVar21 - (long)(puVar25 + -0x10);
          uVar46 = (uint)(pbVar22 + __n);
          *out_size = uVar46;
          *puVar19 = '\x01';
          puVar19[1] = (char)(pbVar22 + __n) + 0xf7;
          puVar19[2] = (uchar)(uVar46 + 0xfff7 >> 8);
          puVar19[3] = (uchar)(uVar46 + 0xfffff7 >> 0x10);
          puVar19[4] = (uchar)(uVar46 - 9 >> 0x18);
          puVar19[5] = (uchar)in_size;
          puVar19[6] = (uchar)(in_size >> 8);
          puVar19[7] = (uchar)(in_size >> 0x10);
          puVar19[8] = (uchar)(in_size >> 0x18);
          memmove(puVar19 + ((uint)pbVar22 & 0x3ffff),puVar25 + -0x10,__n);
          return puVar19;
        }
      }
    }
  }
LAB_0012deb8:
  __assert_fail("sym->x_max != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_byte.h"
                ,0x10f,"void RansEncPutSymbol(RansState *, uint8_t **, const RansEncSymbol *)");
}

Assistant:

unsigned char *rans_compress_O1(unsigned char *in, unsigned int in_size,
				unsigned int *out_size) {
    unsigned char *out_buf, *out_end, *cp;
    unsigned int last_i, tab_size, rle_i, rle_j;
    RansEncSymbol syms[256][256];

    if (in_size < 4)
	return rans_compress_O0(in, in_size, out_size);

    out_buf = malloc(1.05*in_size + 257*257*3 + 9);
    if (!out_buf)
	return NULL;

    out_end = out_buf + (int)(1.05*in_size) + 257*257*3 + 9;
    cp = out_buf+9;

    int F[256][256], T[256], i, j;
    unsigned char c;

    memset(F, 0, 256*256*sizeof(int));
    memset(T, 0, 256*sizeof(int));
    //for (last = 0, i=in_size-1; i>=0; i--) {
    //	F[last][c = in[i]]++;
    //	T[last]++;
    //	last = c;
    //}

    for (last_i=i=0; i<in_size; i++) {
	F[last_i][c = in[i]]++;
	T[last_i]++;
	last_i = c;
    }
    F[0][in[1*(in_size>>2)]]++;
    F[0][in[2*(in_size>>2)]]++;
    F[0][in[3*(in_size>>2)]]++;
    T[0]+=3;

    // Normalise so T[i] == TOTFREQ
    for (rle_i = i = 0; i < 256; i++) {
	int t2, m, M;
	unsigned int x;

	if (T[i] == 0)
	    continue;

	//uint64_t p = (TOTFREQ * TOTFREQ) / t;
	double p = ((double)TOTFREQ)/T[i];
	for (t2 = m = M = j = 0; j < 256; j++) {
	    if (!F[i][j])
		continue;

	    if (m < F[i][j])
		m = F[i][j], M = j;

	    //if ((F[i][j] = (F[i][j] * p) / TOTFREQ) == 0)
	    if ((F[i][j] *= p) == 0)
		F[i][j] = 1;
	    t2 += F[i][j];
	}

	t2++;
	if (t2 < TOTFREQ)
	    F[i][M] += TOTFREQ-t2;
	else
	    F[i][M] -= t2-TOTFREQ;

	// Store frequency table
	// i
	if (rle_i) {
	    rle_i--;
	} else {
	    *cp++ = i;
	    // FIXME: could use order-0 statistics to observe which alphabet
	    // symbols are present and base RLE on that ordering instead.
	    if (i && T[i-1]) {
		for(rle_i=i+1; rle_i<256 && T[rle_i]; rle_i++)
		    ;
		rle_i -= i+1;
		*cp++ = rle_i;
	    }
	}

	int *F_i_ = F[i];
	x = 0;
	rle_j = 0;
	for (j = 0; j < 256; j++) {
	    if (F_i_[j]) {
		//fprintf(stderr, "F[%d][%d]=%d, x=%d\n", i, j, F_i_[j], x);

		// j
		if (rle_j) {
		    rle_j--;
		} else {
		    *cp++ = j;
		    if (!rle_j && j && F_i_[j-1]) {
			for(rle_j=j+1; rle_j<256 && F_i_[rle_j]; rle_j++)
			    ;
			rle_j -= j+1;
			*cp++ = rle_j;
		    }
		}

		// F_i_[j]
		if (F_i_[j]<128) {
		    *cp++ = F_i_[j];
		} else {
		    *cp++ = 128 | (F_i_[j]>>8);
		    *cp++ = F_i_[j]&0xff;
		}

		RansEncSymbolInit(&syms[i][j], x, F_i_[j], TF_SHIFT);
		x += F_i_[j];
	    }
	}
	*cp++ = 0;
    }
    *cp++ = 0;

    //write(1, out_buf+4, cp-(out_buf+4));
    tab_size = cp - out_buf;
    assert(tab_size < 257*257*3);

    RansState rans0, rans1, rans2, rans3;
    RansEncInit(&rans0);
    RansEncInit(&rans1);
    RansEncInit(&rans2);
    RansEncInit(&rans3);

    uint8_t* ptr = out_end;

    int isz4 = in_size>>2;
    int i0 = 1*isz4-2;
    int i1 = 2*isz4-2;
    int i2 = 3*isz4-2;
    int i3 = 4*isz4-2;

    unsigned char l0 = in[i0+1];
    unsigned char l1 = in[i1+1];
    unsigned char l2 = in[i2+1];
    unsigned char l3 = in[i3+1];

    // Deal with the remainder
    l3 = in[in_size-1];
    for (i3 = in_size-2; i3 > 4*isz4-2; i3--) {
	unsigned char c3 = in[i3];
	RansEncPutSymbol(&rans3, &ptr, &syms[c3][l3]);
	l3 = c3;
    }

    for (; i0 >= 0; i0--, i1--, i2--, i3--) {
	unsigned char c0, c1, c2, c3;
	RansEncSymbol *s3 = &syms[c3 = in[i3]][l3];
	RansEncSymbol *s2 = &syms[c2 = in[i2]][l2];
	RansEncSymbol *s1 = &syms[c1 = in[i1]][l1];
	RansEncSymbol *s0 = &syms[c0 = in[i0]][l0];

	RansEncPutSymbol(&rans3, &ptr, s3);
	RansEncPutSymbol(&rans2, &ptr, s2);
	RansEncPutSymbol(&rans1, &ptr, s1);
	RansEncPutSymbol(&rans0, &ptr, s0);

	l0 = c0;
	l1 = c1;
	l2 = c2;
	l3 = c3;
    }

    RansEncPutSymbol(&rans3, &ptr, &syms[0][l3]);
    RansEncPutSymbol(&rans2, &ptr, &syms[0][l2]);
    RansEncPutSymbol(&rans1, &ptr, &syms[0][l1]);
    RansEncPutSymbol(&rans0, &ptr, &syms[0][l0]);

    RansEncFlush(&rans3, &ptr);
    RansEncFlush(&rans2, &ptr);
    RansEncFlush(&rans1, &ptr);
    RansEncFlush(&rans0, &ptr);

    *out_size = (out_end - ptr) + tab_size;

    cp = out_buf;
    *cp++ = 1; // order

    *cp++ = ((*out_size-9)>> 0) & 0xff;
    *cp++ = ((*out_size-9)>> 8) & 0xff;
    *cp++ = ((*out_size-9)>>16) & 0xff;
    *cp++ = ((*out_size-9)>>24) & 0xff;

    *cp++ = (in_size>> 0) & 0xff;
    *cp++ = (in_size>> 8) & 0xff;
    *cp++ = (in_size>>16) & 0xff;
    *cp++ = (in_size>>24) & 0xff;

    memmove(out_buf + tab_size, ptr, out_end-ptr);

    return out_buf;
}